

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.cpp
# Opt level: O0

void __thiscall CJobPool::Shutdown(CJobPool *this)

{
  int *in_RDI;
  int i;
  int local_c;
  
  if ((*(byte *)(in_RDI + 0x42) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x42) = 1;
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      thread_wait((void *)0x14d834);
      thread_destroy(*(void **)(in_RDI + (long)local_c * 2 + 2));
    }
    lock_destroy((LOCK)0x14d864);
  }
  return;
}

Assistant:

void CJobPool::Shutdown()
{
	if(m_Shutdown)
		return;

	m_Shutdown = true;
	for(int i = 0; i < m_NumThreads; i++)
	{
		thread_wait(m_apThreads[i]);
		thread_destroy(m_apThreads[i]);
	}
	lock_destroy(m_Lock);
}